

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O3

void __thiscall tetgenio::deinitialize(tetgenio *this)

{
  void *pvVar1;
  int iVar2;
  facet *pfVar3;
  vorofacet *pvVar4;
  int **ppiVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (this->pointlist != (double *)0x0) {
    operator_delete__(this->pointlist);
  }
  if (this->pointattributelist != (double *)0x0) {
    operator_delete__(this->pointattributelist);
  }
  if (this->pointmtrlist != (double *)0x0) {
    operator_delete__(this->pointmtrlist);
  }
  if (this->pointmarkerlist != (int *)0x0) {
    operator_delete__(this->pointmarkerlist);
  }
  if (this->point2tetlist != (int *)0x0) {
    operator_delete__(this->point2tetlist);
  }
  if (this->pointparamlist != (pointparam *)0x0) {
    operator_delete__(this->pointparamlist);
  }
  if (this->tetrahedronlist != (int *)0x0) {
    operator_delete__(this->tetrahedronlist);
  }
  if (this->tetrahedronattributelist != (double *)0x0) {
    operator_delete__(this->tetrahedronattributelist);
  }
  if (this->tetrahedronvolumelist != (double *)0x0) {
    operator_delete__(this->tetrahedronvolumelist);
  }
  if (this->neighborlist != (int *)0x0) {
    operator_delete__(this->neighborlist);
  }
  if (this->tet2facelist != (int *)0x0) {
    operator_delete__(this->tet2facelist);
  }
  if (this->tet2edgelist != (int *)0x0) {
    operator_delete__(this->tet2edgelist);
  }
  if (this->trifacelist != (int *)0x0) {
    operator_delete__(this->trifacelist);
  }
  if (this->trifacemarkerlist != (int *)0x0) {
    operator_delete__(this->trifacemarkerlist);
  }
  if (this->o2facelist != (int *)0x0) {
    operator_delete__(this->o2facelist);
  }
  if (this->face2tetlist != (int *)0x0) {
    operator_delete__(this->face2tetlist);
  }
  if (this->face2edgelist != (int *)0x0) {
    operator_delete__(this->face2edgelist);
  }
  if (this->edgelist != (int *)0x0) {
    operator_delete__(this->edgelist);
  }
  if (this->edgemarkerlist != (int *)0x0) {
    operator_delete__(this->edgemarkerlist);
  }
  if (this->o2edgelist != (int *)0x0) {
    operator_delete__(this->o2edgelist);
  }
  if (this->edge2tetlist != (int *)0x0) {
    operator_delete__(this->edge2tetlist);
  }
  pfVar3 = this->facetlist;
  if (pfVar3 != (facet *)0x0) {
    if (0 < this->numberoffacets) {
      lVar8 = 0;
      do {
        pfVar3 = this->facetlist + lVar8;
        iVar2 = this->facetlist[lVar8].numberofpolygons;
        if (0 < iVar2) {
          lVar6 = 0;
          lVar7 = 0;
          do {
            pvVar1 = *(void **)((long)&pfVar3->polygonlist->vertexlist + lVar6);
            if (pvVar1 != (void *)0x0) {
              operator_delete__(pvVar1);
              iVar2 = pfVar3->numberofpolygons;
            }
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 0x10;
          } while (lVar7 < iVar2);
        }
        if (pfVar3->polygonlist != (polygon *)0x0) {
          operator_delete__(pfVar3->polygonlist);
        }
        if (pfVar3->holelist != (double *)0x0) {
          operator_delete__(pfVar3->holelist);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->numberoffacets);
      pfVar3 = this->facetlist;
      if (pfVar3 == (facet *)0x0) goto LAB_0010cc42;
    }
    operator_delete__(pfVar3);
  }
LAB_0010cc42:
  if (this->facetmarkerlist != (int *)0x0) {
    operator_delete__(this->facetmarkerlist);
  }
  if (this->holelist != (double *)0x0) {
    operator_delete__(this->holelist);
  }
  if (this->regionlist != (double *)0x0) {
    operator_delete__(this->regionlist);
  }
  if (this->facetconstraintlist != (double *)0x0) {
    operator_delete__(this->facetconstraintlist);
  }
  if (this->segmentconstraintlist != (double *)0x0) {
    operator_delete__(this->segmentconstraintlist);
  }
  if (this->vpointlist != (double *)0x0) {
    operator_delete__(this->vpointlist);
  }
  if (this->vedgelist != (voroedge *)0x0) {
    operator_delete__(this->vedgelist);
  }
  pvVar4 = this->vfacetlist;
  if (pvVar4 != (vorofacet *)0x0) {
    iVar2 = this->numberofvfacets;
    if (0 < iVar2) {
      lVar8 = 8;
      lVar6 = 0;
      do {
        pvVar1 = *(void **)((long)&this->vfacetlist->c1 + lVar8);
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
          iVar2 = this->numberofvfacets;
        }
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar6 < iVar2);
      pvVar4 = this->vfacetlist;
      if (pvVar4 == (vorofacet *)0x0) goto LAB_0010cd13;
    }
    operator_delete__(pvVar4);
  }
LAB_0010cd13:
  ppiVar5 = this->vcelllist;
  if (ppiVar5 == (int **)0x0) {
    return;
  }
  iVar2 = this->numberofvcells;
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      if (this->vcelllist[lVar8] != (int *)0x0) {
        operator_delete__(this->vcelllist[lVar8]);
        iVar2 = this->numberofvcells;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar2);
    ppiVar5 = this->vcelllist;
    if (ppiVar5 == (int **)0x0) {
      return;
    }
  }
  operator_delete__(ppiVar5);
  return;
}

Assistant:

void deinitialize()
  {
    int i, j;

    if (pointlist != (REAL *) NULL) {
      delete [] pointlist;
    }
    if (pointattributelist != (REAL *) NULL) {
      delete [] pointattributelist;
    }
    if (pointmtrlist != (REAL *) NULL) {
      delete [] pointmtrlist;
    }
    if (pointmarkerlist != (int *) NULL) {
      delete [] pointmarkerlist;
    }
	if (point2tetlist != (int *) NULL) {
      delete [] point2tetlist;
    }
    if (pointparamlist != (pointparam *) NULL) {
      delete [] pointparamlist;
    }

    if (tetrahedronlist != (int *) NULL) {
      delete [] tetrahedronlist;
    }
    if (tetrahedronattributelist != (REAL *) NULL) {
      delete [] tetrahedronattributelist;
    }
    if (tetrahedronvolumelist != (REAL *) NULL) {
      delete [] tetrahedronvolumelist;
    }
    if (neighborlist != (int *) NULL) {
      delete [] neighborlist;
    }
    if (tet2facelist != (int *) NULL) {
	  delete [] tet2facelist;
	}
	if (tet2edgelist != (int *) NULL) {
	  delete [] tet2edgelist;
	}

    if (trifacelist != (int *) NULL) {
      delete [] trifacelist;
    }
    if (trifacemarkerlist != (int *) NULL) {
      delete [] trifacemarkerlist;
    }
    if (o2facelist != (int *) NULL) {
      delete [] o2facelist;
    }
    if (face2tetlist != (int *) NULL) {
      delete [] face2tetlist;
    }
	if (face2edgelist != (int *) NULL) {
      delete [] face2edgelist;
    }

    if (edgelist != (int *) NULL) {
      delete [] edgelist;
    }
    if (edgemarkerlist != (int *) NULL) {
      delete [] edgemarkerlist;
    }
    if (o2edgelist != (int *) NULL) {
      delete [] o2edgelist;
    }
    if (edge2tetlist != (int *) NULL) {
      delete [] edge2tetlist;
    }

    if (facetlist != (facet *) NULL) {
      facet *f;
      polygon *p;
      for (i = 0; i < numberoffacets; i++) {
        f = &facetlist[i];
        for (j = 0; j < f->numberofpolygons; j++) {
          p = &f->polygonlist[j];
          delete [] p->vertexlist;
        }
        delete [] f->polygonlist;
        if (f->holelist != (REAL *) NULL) {
          delete [] f->holelist;
        }
      }
      delete [] facetlist;
    }
    if (facetmarkerlist != (int *) NULL) {
      delete [] facetmarkerlist;
    }

    if (holelist != (REAL *) NULL) {
      delete [] holelist;
    }
    if (regionlist != (REAL *) NULL) {
      delete [] regionlist;
    }
    if (facetconstraintlist != (REAL *) NULL) {
      delete [] facetconstraintlist;
    }
    if (segmentconstraintlist != (REAL *) NULL) {
      delete [] segmentconstraintlist;
    }
    if (vpointlist != (REAL *) NULL) {
      delete [] vpointlist;
    }
    if (vedgelist != (voroedge *) NULL) {
      delete [] vedgelist;
    }
    if (vfacetlist != (vorofacet *) NULL) {
      for (i = 0; i < numberofvfacets; i++) {
        delete [] vfacetlist[i].elist;
      }
      delete [] vfacetlist;
    }
    if (vcelllist != (int **) NULL) {
      for (i = 0; i < numberofvcells; i++) {
        delete [] vcelllist[i];
      }
      delete [] vcelllist;
    }
  }